

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::RewindLoopFixedGroupLastIterationCont::Exec
          (RewindLoopFixedGroupLastIterationCont *this,Matcher *matcher,Char *input,
          CharCount *inputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks)

{
  code *pcVar1;
  bool bVar2;
  BeginLoopFixedGroupLastIterationInst *pBVar3;
  LoopInfo *pLVar4;
  GroupInfo *this_00;
  undefined4 *puVar5;
  uint8 *puVar6;
  GroupInfo *groupInfo;
  LoopInfo *loopInfo;
  BeginLoopFixedGroupLastIterationInst *begin;
  ContStack *contStack_local;
  uint8 **instPointer_local;
  CharCount *inputOffset_local;
  Char *input_local;
  Matcher *matcher_local;
  RewindLoopFixedGroupLastIterationCont *this_local;
  
  Matcher::QueryContinue(matcher,qcTicks);
  pBVar3 = Matcher::LabelToInstPointer<UnifiedRegex::BeginLoopFixedGroupLastIterationInst>
                     (matcher,BeginLoopFixedGroupLastIteration,
                      *(Label *)&(this->super_Cont).field_0xc);
  pLVar4 = Matcher::LoopIdToLoopInfo
                     (matcher,(pBVar3->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId);
  this_00 = Matcher::GroupIdToGroupInfo(matcher,(pBVar3->super_GroupMixin).groupId);
  if ((this->tryingBody & 1U) == 0) {
    if (pLVar4->number <= (pBVar3->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x12f3,"(loopInfo->number > begin->repeats.lower)",
                         "loopInfo->number > begin->repeats.lower");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pLVar4->number = pLVar4->number - 1;
  }
  else {
    this->tryingBody = false;
    if (pLVar4->number < (pBVar3->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x12ee,"(loopInfo->number >= begin->repeats.lower)",
                         "loopInfo->number >= begin->repeats.lower");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  *inputOffset = pLVar4->startInputOffset + pLVar4->number * (pBVar3->super_FixedLengthMixin).length
  ;
  if (pLVar4->number == 0) {
    GroupInfo::Reset(this_00);
  }
  else {
    this_00->offset = *inputOffset - (pBVar3->super_FixedLengthMixin).length;
    this_00->length = (pBVar3->super_FixedLengthMixin).length;
  }
  if ((pBVar3->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower < pLVar4->number) {
    ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
    UnPop<UnifiedRegex::RewindLoopFixedGroupLastIterationCont>
              (&contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    Matcher::UnPopStats(matcher,contStack,input);
  }
  puVar6 = Matcher::LabelToInstPointer(matcher,(pBVar3->super_BeginLoopMixin).exitLabel);
  *instPointer = puVar6;
  return true;
}

Assistant:

inline bool RewindLoopFixedGroupLastIterationCont::Exec(REGEX_CONT_EXEC_PARAMETERS)
    {
        matcher.QueryContinue(qcTicks);

        BeginLoopFixedGroupLastIterationInst* begin = matcher.L2I(BeginLoopFixedGroupLastIteration, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);
        GroupInfo* groupInfo = matcher.GroupIdToGroupInfo(begin->groupId);

        if (tryingBody)
        {
            tryingBody = false;
            // loopInfo->number is the number of iterations completed before current attempt of body
            Assert(loopInfo->number >= begin->repeats.lower);
        }
        else
        {
            // loopInfo->number is the number of iterations completed before trying follow
            Assert(loopInfo->number > begin->repeats.lower);
            // Try follow with one fewer iteration
            loopInfo->number--;
        }

        // Rewind input
        inputOffset = loopInfo->startInputOffset + loopInfo->number * begin->length;

        if (loopInfo->number > 0)
        {
            // Bind previous iteration's body
            groupInfo->offset = inputOffset - begin->length;
            groupInfo->length = begin->length;
        }
        else
        {
            groupInfo->Reset();
        }

        if (loopInfo->number > begin->repeats.lower)
        {
            // Un-pop the continuation ready for next time
            contStack.UnPop<RewindLoopFixedGroupLastIterationCont>();
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.UnPopStats(contStack, input);
#endif
        }
        // else: Can't try any fewer iterations if follow fails, so leave continuation as popped and let failure propagate

        instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        return true; // STOP BACKTRACKING
    }